

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> * __thiscall
evaluator::Evaluator::evalProgram_abi_cxx11_
          (list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
           *__return_storage_ptr__,Evaluator *this,Program *program,Env *env)

{
  bool bVar1;
  reference ppSVar2;
  Object *pOVar3;
  long local_88;
  ReturnObject *res;
  GCPtr<symbols::Object> local_50;
  GCPtr<symbols::Object> result;
  Stmt *stmt;
  iterator __end1;
  iterator __begin1;
  vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_> *__range1;
  Env *env_local;
  Program *program_local;
  list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *evaluatedStmts;
  
  std::__cxx11::list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::list
            (__return_storage_ptr__);
  __end1 = std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::begin
                     ((vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_> *)(this + 0x10));
  stmt = (Stmt *)std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::end
                           ((vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_> *)(this + 0x10));
  while (bVar1 = __gnu_cxx::
                 operator==<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
                           (&__end1,(__normal_iterator<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
                                     *)&stmt), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppSVar2 = __gnu_cxx::
              __normal_iterator<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
              ::operator*(&__end1);
    result.addr = (Object *)*ppSVar2;
    Eval((Evaluator *)&local_50,(Node *)result.addr,(Env *)program);
    pOVar3 = GCPtr<symbols::Object>::raw(&local_50);
    if (pOVar3 == (Object *)0x0) {
      local_88 = 0;
    }
    else {
      local_88 = __dynamic_cast(pOVar3,&symbols::Object::typeinfo,&symbols::ReturnObject::typeinfo,0
                               );
    }
    if (local_88 != 0) {
      GCPtr<symbols::Object>::operator=(&local_50,*(Object **)(local_88 + 0x10));
    }
    std::__cxx11::list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::push_back
              (__return_storage_ptr__,&local_50);
    GCPtr<symbols::Object>::~GCPtr(&local_50);
    __gnu_cxx::
    __normal_iterator<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

list<GCPtr<Object>> Evaluator::evalProgram(Program *program, Env* env){
    list<GCPtr<Object>> evaluatedStmts;
    for(auto stmt : program->Stmts){
        auto result = Eval(stmt, env);
        if(auto res = dynamic_cast<ReturnObject*>(result.raw())){
            result =  res->value;
        }
        evaluatedStmts.push_back(result);
    }
    return evaluatedStmts;
}